

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

void helicsCoreAddDestinationFilterToEndpoint
               (HelicsCore core,char *filter,char *endpoint,HelicsError *err)

{
  Core *pCVar1;
  HelicsError *in_RCX;
  long in_RDX;
  long in_RSI;
  Core *cppcore;
  HelicsError *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  undefined8 local_38;
  undefined8 local_30;
  
  pCVar1 = getCore(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (pCVar1 != (Core *)0x0) {
    if ((in_RSI == 0) || (in_RDX == 0)) {
      assignError(in_RCX,-4,"Data link arguments cannot be null");
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      (*pCVar1->_vptr_Core[0x49])
                (pCVar1,local_38,local_30,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
    }
  }
  return;
}

Assistant:

void helicsCoreAddDestinationFilterToEndpoint(HelicsCore core, const char* filter, const char* endpoint, HelicsError* err)
{
    auto* cppcore = getCore(core, err);
    if (cppcore == nullptr) {
        return;
    }
    if ((filter == nullptr) || (endpoint == nullptr)) {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidDataLinkString);
        return;
    }
    cppcore->addDestinationFilterToEndpoint(filter, endpoint);
}